

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_pedersen_commitment_to_pubkey
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey,secp256k1_pedersen_commitment *commit
              )

{
  secp256k1_ge Q;
  secp256k1_fe fe;
  secp256k1_ge_storage s;
  secp256k1_ge local_d8;
  secp256k1_fe local_80;
  secp256k1_ge_storage local_58;
  
  if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_pedersen_commitment_to_pubkey_cold_2();
  }
  else {
    pubkey->data[0x30] = '\0';
    pubkey->data[0x31] = '\0';
    pubkey->data[0x32] = '\0';
    pubkey->data[0x33] = '\0';
    pubkey->data[0x34] = '\0';
    pubkey->data[0x35] = '\0';
    pubkey->data[0x36] = '\0';
    pubkey->data[0x37] = '\0';
    pubkey->data[0x38] = '\0';
    pubkey->data[0x39] = '\0';
    pubkey->data[0x3a] = '\0';
    pubkey->data[0x3b] = '\0';
    pubkey->data[0x3c] = '\0';
    pubkey->data[0x3d] = '\0';
    pubkey->data[0x3e] = '\0';
    pubkey->data[0x3f] = '\0';
    pubkey->data[0x20] = '\0';
    pubkey->data[0x21] = '\0';
    pubkey->data[0x22] = '\0';
    pubkey->data[0x23] = '\0';
    pubkey->data[0x24] = '\0';
    pubkey->data[0x25] = '\0';
    pubkey->data[0x26] = '\0';
    pubkey->data[0x27] = '\0';
    pubkey->data[0x28] = '\0';
    pubkey->data[0x29] = '\0';
    pubkey->data[0x2a] = '\0';
    pubkey->data[0x2b] = '\0';
    pubkey->data[0x2c] = '\0';
    pubkey->data[0x2d] = '\0';
    pubkey->data[0x2e] = '\0';
    pubkey->data[0x2f] = '\0';
    pubkey->data[0x10] = '\0';
    pubkey->data[0x11] = '\0';
    pubkey->data[0x12] = '\0';
    pubkey->data[0x13] = '\0';
    pubkey->data[0x14] = '\0';
    pubkey->data[0x15] = '\0';
    pubkey->data[0x16] = '\0';
    pubkey->data[0x17] = '\0';
    pubkey->data[0x18] = '\0';
    pubkey->data[0x19] = '\0';
    pubkey->data[0x1a] = '\0';
    pubkey->data[0x1b] = '\0';
    pubkey->data[0x1c] = '\0';
    pubkey->data[0x1d] = '\0';
    pubkey->data[0x1e] = '\0';
    pubkey->data[0x1f] = '\0';
    pubkey->data[0] = '\0';
    pubkey->data[1] = '\0';
    pubkey->data[2] = '\0';
    pubkey->data[3] = '\0';
    pubkey->data[4] = '\0';
    pubkey->data[5] = '\0';
    pubkey->data[6] = '\0';
    pubkey->data[7] = '\0';
    pubkey->data[8] = '\0';
    pubkey->data[9] = '\0';
    pubkey->data[10] = '\0';
    pubkey->data[0xb] = '\0';
    pubkey->data[0xc] = '\0';
    pubkey->data[0xd] = '\0';
    pubkey->data[0xe] = '\0';
    pubkey->data[0xf] = '\0';
    if (commit != (secp256k1_pedersen_commitment *)0x0) {
      secp256k1_fe_set_b32(&local_80,commit->data + 1);
      secp256k1_ge_set_xquad(&local_d8,&local_80);
      if ((commit->data[0] & 1) != 0) {
        secp256k1_ge_neg(&local_d8,&local_d8);
      }
      secp256k1_ge_to_storage(&local_58,&local_d8);
      *(uint64_t *)(pubkey->data + 0x30) = local_58.y.n[2];
      *(uint64_t *)(pubkey->data + 0x38) = local_58.y.n[3];
      *(uint64_t *)(pubkey->data + 0x20) = local_58.y.n[0];
      *(uint64_t *)(pubkey->data + 0x28) = local_58.y.n[1];
      *(uint64_t *)(pubkey->data + 0x10) = local_58.x.n[2];
      *(uint64_t *)(pubkey->data + 0x18) = local_58.x.n[3];
      *(uint64_t *)pubkey->data = local_58.x.n[0];
      *(uint64_t *)(pubkey->data + 8) = local_58.x.n[1];
      return 1;
    }
    secp256k1_pedersen_commitment_to_pubkey_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_pedersen_commitment_to_pubkey(const secp256k1_context* ctx, secp256k1_pubkey* pubkey, const secp256k1_pedersen_commitment* commit) {
    secp256k1_ge Q;
    secp256k1_fe fe;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(commit != NULL);

    secp256k1_fe_set_b32(&fe, &commit->data[1]);
    secp256k1_ge_set_xquad(&Q, &fe);
    if (commit->data[0] & 1) {
        secp256k1_ge_neg(&Q, &Q);
    }
    secp256k1_pubkey_save(pubkey, &Q);
    secp256k1_ge_clear(&Q);
    return 1;
}